

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

uint32_t spvtools::val::anon_unknown_0::getBaseAlignment
                   (uint32_t member_id,bool roundUp,LayoutConstraints *inherited,
                   MemberConstraints *constraints,ValidationState_t *vstate)

{
  ValidationState_t *this;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  Instruction *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  size_type sVar4;
  const_reference pvVar5;
  uint *puVar6;
  value_type local_b8;
  value_type local_b0;
  uint32_t local_a4;
  pair<unsigned_int,_unsigned_int> local_a0;
  mapped_type *local_98;
  mapped_type *constraint;
  uint local_88;
  value_type id;
  uint32_t numMembers;
  uint32_t memberIdx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> members;
  uint32_t componentAlignment_1;
  value_type component_id;
  Instruction *component_inst;
  value_type num_columns;
  value_type column_type;
  uint32_t componentAlignment;
  value_type numComponents;
  value_type componentId;
  uint32_t baseAlignment;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *words;
  Instruction *inst;
  ValidationState_t *vstate_local;
  MemberConstraints *constraints_local;
  LayoutConstraints *inherited_local;
  uint32_t local_10;
  bool roundUp_local;
  uint32_t member_id_local;
  
  inst = (Instruction *)vstate;
  vstate_local = (ValidationState_t *)constraints;
  constraints_local = (MemberConstraints *)inherited;
  inherited_local._7_1_ = roundUp;
  local_10 = member_id;
  words = &ValidationState_t::FindDef(vstate,member_id)->words_;
  _componentId = Instruction::words((Instruction *)words);
  numComponents = 1;
  OVar2 = Instruction::opcode((Instruction *)words);
  if (OVar2 - OpTypeInt < 2) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_componentId,2);
    numComponents = *pvVar5 >> 3;
  }
  else if (OVar2 == OpTypeVector) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_componentId,2);
    uVar3 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_componentId,3);
    local_b0 = *pvVar5;
    uVar3 = getBaseAlignment(uVar3,(bool)(inherited_local._7_1_ & 1),
                             (LayoutConstraints *)constraints_local,
                             (MemberConstraints *)vstate_local,(ValidationState_t *)inst);
    if (local_b0 == 3) {
      local_b0 = 4;
    }
    numComponents = uVar3 * local_b0;
  }
  else if (OVar2 == OpTypeMatrix) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_componentId,2);
    uVar3 = *pvVar5;
    if (*(int *)&(constraints_local->_M_h)._M_buckets == 1) {
      numComponents =
           getBaseAlignment(uVar3,(bool)(inherited_local._7_1_ & 1),
                            (LayoutConstraints *)constraints_local,(MemberConstraints *)vstate_local
                            ,(ValidationState_t *)inst);
    }
    else {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_componentId,3);
      local_b8 = *pvVar5;
      this_00 = ValidationState_t::FindDef((ValidationState_t *)inst,uVar3);
      this_01 = Instruction::words(this_00);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,2);
      members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar5;
      members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           getBaseAlignment(members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                            (bool)(inherited_local._7_1_ & 1),(LayoutConstraints *)constraints_local
                            ,(MemberConstraints *)vstate_local,(ValidationState_t *)inst);
      if (local_b8 == 3) {
        local_b8 = 4;
      }
      numComponents =
           (uint32_t)
           members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage * local_b8;
    }
    if ((inherited_local._7_1_ & 1) != 0) {
      numComponents = align(numComponents,0x10);
    }
  }
  else {
    if (OVar2 - OpTypeImage < 3) {
      bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst,BindlessTextureNV);
      if (bVar1) {
        uVar3 = ValidationState_t::samplerimage_variable_address_mode((ValidationState_t *)inst);
        return uVar3 >> 3;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                    ,0xad,
                    "uint32_t spvtools::val::(anonymous namespace)::getBaseAlignment(uint32_t, bool, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                   );
    }
    if (OVar2 - OpTypeArray < 2) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_componentId,2);
      numComponents =
           getBaseAlignment(*pvVar5,(bool)(inherited_local._7_1_ & 1),
                            (LayoutConstraints *)constraints_local,(MemberConstraints *)vstate_local
                            ,(ValidationState_t *)inst);
      if ((inherited_local._7_1_ & 1) != 0) {
        numComponents = align(numComponents,0x10);
      }
    }
    else if (OVar2 == OpTypeStruct) {
      getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numMembers,local_10,
                       (ValidationState_t *)inst);
      id = 0;
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numMembers);
      local_88 = (uint)sVar4;
      for (; id < local_88; id = id + 1) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numMembers,
                            (ulong)id);
        this = vstate_local;
        constraint._4_4_ = *pvVar5;
        local_a0 = std::make_pair<unsigned_int&,unsigned_int&>(&local_10,&id);
        local_98 = std::
                   unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                   ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                                 *)this,&local_a0);
        local_a4 = getBaseAlignment(constraint._4_4_,(bool)(inherited_local._7_1_ & 1),local_98,
                                    (MemberConstraints *)vstate_local,(ValidationState_t *)inst);
        puVar6 = std::max<unsigned_int>(&numComponents,&local_a4);
        numComponents = *puVar6;
      }
      if ((inherited_local._7_1_ & 1) != 0) {
        numComponents = align(numComponents,0x10);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numMembers);
    }
    else {
      if ((OVar2 != OpTypePointer) && (OVar2 != OpTypeUntypedPointerKHR)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                      ,0xe7,
                      "uint32_t spvtools::val::(anonymous namespace)::getBaseAlignment(uint32_t, bool, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                     );
      }
      numComponents = ValidationState_t::pointer_size_and_alignment((ValidationState_t *)inst);
    }
  }
  return numComponents;
}

Assistant:

uint32_t getBaseAlignment(uint32_t member_id, bool roundUp,
                          const LayoutConstraints& inherited,
                          MemberConstraints& constraints,
                          ValidationState_t& vstate) {
  const auto inst = vstate.FindDef(member_id);
  const auto& words = inst->words();
  // Minimal alignment is byte-aligned.
  uint32_t baseAlignment = 1;
  switch (inst->opcode()) {
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
      if (vstate.HasCapability(spv::Capability::BindlessTextureNV))
        return baseAlignment = vstate.samplerimage_variable_address_mode() / 8;
      assert(0);
      return 0;
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      baseAlignment = words[2] / 8;
      break;
    case spv::Op::OpTypeVector: {
      const auto componentId = words[2];
      const auto numComponents = words[3];
      const auto componentAlignment = getBaseAlignment(
          componentId, roundUp, inherited, constraints, vstate);
      baseAlignment =
          componentAlignment * (numComponents == 3 ? 4 : numComponents);
      break;
    }
    case spv::Op::OpTypeMatrix: {
      const auto column_type = words[2];
      if (inherited.majorness == kColumnMajor) {
        baseAlignment = getBaseAlignment(column_type, roundUp, inherited,
                                         constraints, vstate);
      } else {
        // A row-major matrix of C columns has a base alignment equal to the
        // base alignment of a vector of C matrix components.
        const auto num_columns = words[3];
        const auto component_inst = vstate.FindDef(column_type);
        const auto component_id = component_inst->words()[2];
        const auto componentAlignment = getBaseAlignment(
            component_id, roundUp, inherited, constraints, vstate);
        baseAlignment =
            componentAlignment * (num_columns == 3 ? 4 : num_columns);
      }
      if (roundUp) baseAlignment = align(baseAlignment, 16u);
    } break;
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      baseAlignment =
          getBaseAlignment(words[2], roundUp, inherited, constraints, vstate);
      if (roundUp) baseAlignment = align(baseAlignment, 16u);
      break;
    case spv::Op::OpTypeStruct: {
      const auto members = getStructMembers(member_id, vstate);
      for (uint32_t memberIdx = 0, numMembers = uint32_t(members.size());
           memberIdx < numMembers; ++memberIdx) {
        const auto id = members[memberIdx];
        const auto& constraint =
            constraints[std::make_pair(member_id, memberIdx)];
        baseAlignment = std::max(
            baseAlignment,
            getBaseAlignment(id, roundUp, constraint, constraints, vstate));
      }
      if (roundUp) baseAlignment = align(baseAlignment, 16u);
      break;
    }
    case spv::Op::OpTypePointer:
    case spv::Op::OpTypeUntypedPointerKHR:
      baseAlignment = vstate.pointer_size_and_alignment();
      break;
    default:
      assert(0);
      break;
  }

  return baseAlignment;
}